

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

ps_alignment_iter_t * ps_alignment_states(ps_alignment_t *al)

{
  ps_alignment_iter_t *itor;
  ps_alignment_t *al_local;
  
  if ((al->state).n_ent == 0) {
    al_local = (ps_alignment_t *)0x0;
  }
  else {
    al_local = (ps_alignment_t *)
               __ckd_calloc__(1,0x20,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                              ,0x186);
    *(ps_alignment_t **)al_local = al;
    al_local->d2p = (dict2pid_t *)&al->state;
    *(undefined4 *)&(al_local->word).seq = 0;
    *(undefined4 *)((long)&(al_local->word).seq + 4) = 0xffffffff;
  }
  return (ps_alignment_iter_t *)al_local;
}

Assistant:

ps_alignment_iter_t *
ps_alignment_states(ps_alignment_t *al)
{
    ps_alignment_iter_t *itor;

    if (al->state.n_ent == 0)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    itor->al = al;
    itor->vec = &al->state;
    itor->pos = 0;
    /* Iterate over *all* states */
    itor->parent = PS_ALIGNMENT_NONE;
    return itor;
}